

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O3

pboolean p_tree_rb_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key,
                         ppointer value)

{
  PTreeRBNode_ *node;
  PTreeRBNode *node_00;
  PTreeRBNode *pPVar1;
  pint pVar2;
  PTreeBaseNode_ *pPVar3;
  PTreeRBNode *pPVar4;
  PTreeBaseNode_ *pPVar5;
  pboolean pVar6;
  PTreeBaseNode *pPVar7;
  PTreeBaseNode *pPVar8;
  PTreeRBNode *pPVar9;
  
  pPVar3 = *root_node;
  pPVar5 = (PTreeBaseNode_ *)root_node;
  pPVar7 = pPVar3;
  if (pPVar3 == (PTreeBaseNode *)0x0) {
    pPVar7 = (PTreeBaseNode *)0x0;
  }
  else {
    do {
      pVar2 = (*compare_func)(key,pPVar3->key,data);
      if (pVar2 < 0) {
        pPVar5 = pPVar5->left;
        pPVar7 = pPVar5;
      }
      else {
        pPVar8 = pPVar5->left;
        if (pVar2 == 0) {
          if (pPVar8 != (PTreeBaseNode *)0x0) {
            if (key_destroy_func != (PDestroyFunc)0x0) {
              (*key_destroy_func)(pPVar8->key);
              pPVar8 = pPVar5->left;
            }
            if (value_destroy_func != (PDestroyFunc)0x0) {
              (*value_destroy_func)(pPVar8->value);
              pPVar8 = pPVar5->left;
            }
            pPVar8->key = key;
            pPVar5->left->value = value;
            return 0;
          }
          break;
        }
        pPVar5 = (PTreeBaseNode_ *)&pPVar8->right;
        pPVar7 = pPVar8;
      }
      pPVar3 = pPVar5->left;
    } while (pPVar3 != (PTreeBaseNode_ *)0x0);
  }
  pPVar3 = (PTreeBaseNode_ *)p_malloc0(0x30);
  pPVar5->left = pPVar3;
  pVar6 = 0;
  if (pPVar3 != (PTreeBaseNode_ *)0x0) {
    pPVar3->key = key;
    pPVar5->left->value = value;
    pPVar3 = pPVar5->left;
    *(undefined4 *)&pPVar3[1].right = 1;
    pPVar3[1].left = pPVar7;
    node = ((PTreeRBNode *)pPVar5->left)->parent;
    pPVar9 = (PTreeRBNode *)pPVar5->left;
    while (node != (PTreeRBNode *)0x0) {
      if ((node->color & P_TREE_RB_COLOR_BLACK) != 0) {
        return 1;
      }
      node_00 = node->parent;
      pPVar1 = (PTreeRBNode *)(node_00->base).left;
      pPVar4 = pPVar1;
      if (pPVar1 == node) {
        pPVar4 = (PTreeRBNode *)(node_00->base).right;
      }
      if ((pPVar4 == (PTreeRBNode *)0x0) || ((pPVar4->color & P_TREE_RB_COLOR_RED) == 0)) {
        if (pPVar1 == node) {
          if (pPVar9 == (PTreeRBNode *)(node->base).right) {
            pp_tree_rb_rotate_left(node,root_node);
            pPVar9 = (PTreeRBNode *)(pPVar9->base).left;
          }
          node_00->color = P_TREE_RB_COLOR_RED;
          pPVar9->parent->color = P_TREE_RB_COLOR_BLACK;
          pp_tree_rb_rotate_right(node_00,root_node);
          return 1;
        }
        if (pPVar9 == (PTreeRBNode *)(node->base).left) {
          pp_tree_rb_rotate_right(node,root_node);
          pPVar9 = (PTreeRBNode *)(pPVar9->base).right;
        }
        node_00->color = P_TREE_RB_COLOR_RED;
        pPVar9->parent->color = P_TREE_RB_COLOR_BLACK;
        pp_tree_rb_rotate_left(node_00,root_node);
        return 1;
      }
      node->color = P_TREE_RB_COLOR_BLACK;
      pPVar4->color = P_TREE_RB_COLOR_BLACK;
      node_00->color = P_TREE_RB_COLOR_RED;
      pPVar9 = node_00;
      node = node_00->parent;
    }
    pPVar9->color = P_TREE_RB_COLOR_BLACK;
    pVar6 = 1;
  }
  return pVar6;
}

Assistant:

pboolean
p_tree_rb_insert (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  ppointer		key,
		  ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeRBNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeRBNode *) *cur_node)->color  = P_TREE_RB_COLOR_RED;
	((PTreeRBNode *) *cur_node)->parent = (PTreeRBNode *) parent_node;

	/* Balance the tree */
	pp_tree_rb_balance_insert ((PTreeRBNode *) *cur_node, root_node);

	return TRUE;
}